

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::crate::CrateReader::ReadFloatArray
          (CrateReader *this,bool is_compressed,vector<float,_std::allocator<float>_> *d)

{
  uint8_t uVar1;
  StreamReader *pSVar2;
  uint64_t uVar3;
  bool bVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  pointer puVar8;
  long lVar9;
  pointer pfVar10;
  char *pcVar11;
  long lVar12;
  size_t nbytes_1;
  size_t sVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *unaff_R15;
  size_t nbytes;
  uint32_t shapesize;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  uint32_t n;
  uint local_1cc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  vector<float,_std::allocator<float>_> local_1a8 [4];
  ios_base local_138 [264];
  
  if ((this->_version[0] == '\0') && (this->_version[1] < 7)) {
    bVar4 = StreamReader::read4(this->_sr,&local_1cc);
    if (bVar4) {
      bVar4 = StreamReader::read4(this->_sr,(uint32_t *)local_1a8);
      if (bVar4) {
        unaff_R15 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    ((ulong)local_1a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start & 0xffffffff);
      }
      else {
        ::std::__cxx11::string::append((char *)&this->_err);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"ReadFloatArray",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x21d);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Failed to read the number of array elements.",0x2c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      unaff_R15 = &local_1c8;
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append
                ((char *)&this->_err,
                 (ulong)local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      if ((pointer *)
          local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1c8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      ::std::ios_base::~ios_base(local_138);
      bVar4 = false;
    }
    if (bVar4 == false) {
      return false;
    }
  }
  else {
    bVar4 = StreamReader::read8(this->_sr,(uint64_t *)local_1a8);
    unaff_R15 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                local_1a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
    if (!bVar4) {
      ::std::__cxx11::string::append((char *)&this->_err);
      return false;
    }
  }
  if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this->_config).maxArrayElements <
      unaff_R15) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadFloatArray",0xe);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x231);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar11 = "Too many array elements.";
    lVar9 = 0x18;
  }
  else {
    uVar7 = (long)unaff_R15 * 4;
    uVar6 = this->_memoryUsage + uVar7;
    this->_memoryUsage = uVar6;
    if (uVar6 <= (this->_config).maxMemoryBudget) {
      ::std::vector<float,_std::allocator<float>_>::resize(d,(size_type)unaff_R15);
      if (is_compressed) {
        pSVar2 = this->_sr;
        uVar6 = pSVar2->length_;
        uVar3 = pSVar2->idx_;
        if (unaff_R15 < (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10) {
          sVar13 = uVar6 - uVar3;
          if (uVar3 + uVar7 <= uVar6) {
            sVar13 = uVar7;
          }
          bVar4 = sVar13 - 1 < uVar7;
          if (bVar4) {
            memcpy((d->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start,pSVar2->binary_ + uVar3,sVar13);
            pSVar2->idx_ = pSVar2->idx_ + sVar13;
          }
          bVar4 = bVar4 && sVar13 != 0;
          if (bVar4) {
            return bVar4;
          }
        }
        else if (uVar3 + 1 <= uVar6) {
          uVar1 = pSVar2->binary_[uVar3];
          pSVar2->idx_ = uVar3 + 1;
          if (uVar1 == 't') {
            bVar4 = StreamReader::read4(pSVar2,&local_1cc);
            if (bVar4) {
              local_1a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_1a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              ::std::vector<float,_std::allocator<float>_>::resize(local_1a8,(ulong)local_1cc);
              pSVar2 = this->_sr;
              uVar3 = pSVar2->idx_;
              uVar7 = (ulong)local_1cc << 2;
              sVar13 = pSVar2->length_ - uVar3;
              if (uVar3 + (ulong)local_1cc * 4 <= pSVar2->length_) {
                sVar13 = uVar7;
              }
              if (sVar13 - 1 < uVar7) {
                memcpy(local_1a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,pSVar2->binary_ + uVar3,sVar13);
                pSVar2->idx_ = pSVar2->idx_ + sVar13;
                if (sVar13 != 0) {
                  local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start = (uint *)0x0;
                  local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (uint *)0x0;
                  local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                            (&local_1c8,(size_type)unaff_R15);
                  bVar4 = ReadCompressedInts<unsigned_int>
                                    (this,local_1c8.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                     (long)local_1c8.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_1c8.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 2);
                  if (bVar4) {
                    if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start !=
                        local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
                      pfVar10 = (d->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                super__Vector_impl_data._M_start;
                      puVar8 = local_1c8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                      do {
                        *pfVar10 = local_1a8[0].super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start[*puVar8];
                        pfVar10 = pfVar10 + 1;
                        puVar8 = puVar8 + 1;
                      } while (puVar8 != local_1c8.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish);
                    }
                  }
                  else {
                    ::std::__cxx11::string::append((char *)&this->_err);
                  }
                  if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start != (uint *)0x0) {
                    operator_delete(local_1c8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_1c8.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_1c8.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  goto LAB_001ae8cb;
                }
              }
              ::std::__cxx11::string::append((char *)&this->_err);
              if (local_1a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start == (pointer)0x0) {
                return false;
              }
              operator_delete(local_1a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_start,
                              (long)local_1a8[0].super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1a8[0].super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
              return false;
            }
          }
          else if (uVar1 == 'i') {
            local_1a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_1a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ::std::vector<int,_std::allocator<int>_>::resize
                      ((vector<int,_std::allocator<int>_> *)local_1a8,(size_type)unaff_R15);
            bVar4 = ReadCompressedInts<int>
                              (this,(int *)local_1a8[0].
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start,
                               (long)local_1a8[0].super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_1a8[0].super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 2);
            if (bVar4) {
              lVar9 = (long)local_1a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_1a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2;
              if (0 < lVar9) {
                pfVar10 = (d->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                lVar9 = lVar9 + 1;
                lVar12 = 0;
                do {
                  *(float *)((long)pfVar10 + lVar12) =
                       (float)*(int *)((long)local_1a8[0].
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_start + lVar12);
                  lVar9 = lVar9 + -1;
                  lVar12 = lVar12 + 4;
                } while (1 < lVar9);
              }
            }
            else {
              ::std::__cxx11::string::append((char *)&this->_err);
            }
LAB_001ae8cb:
            if (local_1a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_start,
                              (long)local_1a8[0].super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1a8[0].super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (bVar4 == false) {
              return false;
            }
            return true;
          }
        }
      }
      else {
        pSVar2 = this->_sr;
        uVar3 = pSVar2->idx_;
        sVar13 = pSVar2->length_ - uVar3;
        if (uVar3 + uVar7 <= pSVar2->length_) {
          sVar13 = uVar7;
        }
        if (sVar13 - 1 < uVar7) {
          memcpy((d->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start,pSVar2->binary_ + uVar3,sVar13);
          pSVar2->idx_ = pSVar2->idx_ + sVar13;
          if (sVar13 != 0) {
            return true;
          }
        }
      }
      ::std::__cxx11::string::append((char *)&this->_err);
      return false;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadFloatArray",0xe);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x234);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar11 = "Reached to max memory budget.";
    lVar9 = 0x1d;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,lVar9);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::_M_append
            ((char *)&this->_err,
             (ulong)local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  if ((pointer *)
      local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool CrateReader::ReadFloatArray(bool is_compressed, std::vector<float> *d) {

  size_t length;
  // < ver 0.7.0  use 32bit
  if (VERSION_LESS_THAN_0_8_0(_version)) {
      uint32_t shapesize; // not used
      if (!_sr->read4(&shapesize)) {
        PUSH_ERROR("Failed to read the number of array elements.");
        return false;
      }
    uint32_t n;
    if (!_sr->read4(&n)) {
      _err += "Failed to read the number of array elements.\n";
      return false;
    }
    length = size_t(n);
  } else {
    uint64_t n;
    if (!_sr->read8(&n)) {
      _err += "Failed to read the number of array elements.\n";
      return false;
    }

    length = size_t(n);
  }

  if (length > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  CHECK_MEMORY_USAGE(length * sizeof(float));

  d->resize(length);

  if (!is_compressed) {

    // TODO(syoyo): Zero-copy
    if (!_sr->read(sizeof(float) * length, sizeof(float) * length,
                   reinterpret_cast<uint8_t *>(d->data()))) {
      _err += "Failed to read float array data.\n";
      return false;
    }

    return true;
  } else {

    //
    // compressed data is represented by integers or look-up table.
    //

    if (length < crate::kMinCompressedArraySize) {
      size_t sz = sizeof(float) * length;
      // Not stored in compressed.
      // reader.ReadContiguous(odata, osize);
      if (!_sr->read(sz, sz, reinterpret_cast<uint8_t *>(d->data()))) {
        _err += "Failed to read uncompressed array data.\n";
        return false;
      }
      return true;
    }

    // Read the code
    char code;
    if (!_sr->read1(&code)) {
      _err += "Failed to read the code.\n";
      return false;
    }

    if (code == 'i') {
      // Compressed integers.
      std::vector<int32_t> ints;
      ints.resize(length);
      if (!ReadCompressedInts(ints.data(), ints.size())) {
        _err += "Failed to read compressed ints in ReadFloatArray.\n";
        return false;
      }
      std::copy(ints.begin(), ints.end(), d->data());
    } else if (code == 't') {
      // Lookup table & indexes.
      uint32_t lutSize;
      if (!_sr->read4(&lutSize)) {
        _err += "Failed to read lutSize in ReadFloatArray.\n";
        return false;
      }

      std::vector<float> lut;
      lut.resize(lutSize);
      if (!_sr->read(sizeof(float) * lutSize, sizeof(float) * lutSize,
                     reinterpret_cast<uint8_t *>(lut.data()))) {
        _err += "Failed to read lut table in ReadFloatArray.\n";
        return false;
      }

      std::vector<uint32_t> indexes;
      indexes.resize(length);
      if (!ReadCompressedInts(indexes.data(), indexes.size())) {
        _err += "Failed to read lut indices in ReadFloatArray.\n";
        return false;
      }

      auto o = d->data();
      for (auto index : indexes) {
        *o++ = lut[index];
      }
    } else {
      _err += "Invalid code. Data is currupted\n";
      return false;
    }

    return true;
  }

}